

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O0

int MPIABI_Get_library_version(char *version,int *resultlen)

{
  int iVar1;
  undefined1 local_11c [4];
  undefined1 local_118 [4];
  int wrapped_resultlen;
  char wrapped_version [256];
  int *resultlen_local;
  char *version_local;
  
  wrapped_version._248_8_ = resultlen;
  MPI_Get_library_version(local_118,local_11c);
  iVar1 = snprintf(version,0x2000,"MPIwrapper %s, using MPIABI %d.%d.%d, wrapping:\n%s","2.11.1",2,
                   10,0,local_118);
  *(int *)wrapped_version._248_8_ = iVar1;
  return 0;
}

Assistant:

int MPIABI_Get_library_version(char *version, int *resultlen) {
  char wrapped_version[MPI_MAX_LIBRARY_VERSION_STRING];
  int wrapped_resultlen;
  MPI_Get_library_version(wrapped_version, &wrapped_resultlen);

  // TODO: Add MPItrampoline version number as well
  *resultlen = std::snprintf(
      version, MPIABI_MAX_LIBRARY_VERSION_STRING,
      "MPIwrapper %s, using MPIABI %d.%d.%d, wrapping:\n%s", MPIWRAPPER_VERSION,
      MPIABI_VERSION_MAJOR, MPIABI_VERSION_MINOR, MPIABI_VERSION_PATCH,
      wrapped_version);
  return MPI_SUCCESS;
}